

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
fasthuf_decode(_internal_exr_context *pctxt,FastHufDecoder *fhd,uint8_t *src,int numSrcBits,
              uint16_t *dst,int numDstElems)

{
  int numBits;
  int in_ECX;
  __uint64_t *in_RDX;
  uint *in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int i;
  int rleCount;
  uint64_t id;
  int tableIdx;
  int symbol;
  int codeLen;
  int dstIdx;
  int bufferBackNumBits;
  uint64_t bufferBack;
  int bufferNumBits;
  uint64_t buffer;
  uchar *currByte;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_68;
  int iVar1;
  undefined4 uVar2;
  int local_4c;
  ulong local_48;
  exr_result_t local_4;
  
  local_48 = __bswap_64(*in_RDX);
  local_4c = 0x40;
  __bswap_64(in_RDX[1]);
  uVar2 = 0x40;
  iVar1 = 0;
  do {
    if (in_R9D <= iVar1) {
      if (in_ECX + -0x80 == 0) {
        local_4 = 0;
      }
      else {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,
                     "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                     ,in_ECX + -0x80);
        }
        local_4 = 0x17;
      }
      return local_4;
    }
    if (local_48 < *(ulong *)(in_RSI + 0x140f2)) {
      numBits = 0xf;
      while (local_48 < *(ulong *)(in_RSI + (long)numBits * 2 + 0x10004)) {
        numBits = numBits + 1;
      }
      if ((int)(uint)*(byte *)((long)in_RSI + 9) < numBits) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,"Huffman decode error (Decoded an invalid symbol)");
        }
        return 0x17;
      }
      in_stack_ffffffffffffff88 =
           (int *)(*(long *)(in_RSI + (long)numBits * 2 + 0x1007c) +
                  (local_48 >> (0x40U - (char)numBits & 0x3f)));
      if ((int *)(long)(int)in_RSI[1] <= in_stack_ffffffffffffff88) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,"Huffman decode error (Decoded an invalid symbol)");
        }
        return 0x17;
      }
      local_68 = in_RSI[(long)in_stack_ffffffffffffff88 + 3];
    }
    else {
      in_stack_ffffffffffffff94 = in_RSI[(local_48 >> 0x32) + 0x100f2];
      numBits = (int)in_stack_ffffffffffffff94 >> 0x18;
      local_68 = in_stack_ffffffffffffff94 & 0xffffff;
    }
    local_48 = local_48 << ((byte)numBits & 0x3f);
    local_4c = local_4c - numBits;
    if (local_68 == *in_RSI) {
      if (local_4c < 8) {
        FastHufDecoder_refill
                  ((uint64_t *)CONCAT44(uVar2,iVar1),numBits,
                   (uint64_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,
                   (uint8_t **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        local_4c = 0x40;
      }
      in_stack_ffffffffffffff84 = (uint)(byte)(local_48 >> 0x38);
      if (iVar1 < 1) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,"Huffman decode error (RLE code with no previous symbol)");
        }
        return 0x17;
      }
      if (in_R9D < (int)(iVar1 + in_stack_ffffffffffffff84)) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,
                     "Huffman decode error (Symbol run beyond expected output buffer length)");
        }
        return 0x17;
      }
      if (in_stack_ffffffffffffff84 == 0) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))(in_RDI,0x17,"Huffman decode error (Invalid RLE length)");
        }
        return 0x17;
      }
      for (in_stack_ffffffffffffff80 = 0; in_stack_ffffffffffffff80 < (int)in_stack_ffffffffffffff84
          ; in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1) {
        *(undefined2 *)(in_R8 + (long)(iVar1 + in_stack_ffffffffffffff80) * 2) =
             *(undefined2 *)(in_R8 + (long)(iVar1 + -1) * 2);
      }
      iVar1 = in_stack_ffffffffffffff84 + iVar1;
      local_48 = local_48 << 8;
      local_4c = local_4c + -8;
    }
    else {
      *(short *)(in_R8 + (long)iVar1 * 2) = (short)local_68;
      iVar1 = iVar1 + 1;
    }
    if (local_4c < 0x40) {
      FastHufDecoder_refill
                ((uint64_t *)CONCAT44(uVar2,iVar1),numBits,
                 (uint64_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,
                 (uint8_t **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      local_4c = 0x40;
    }
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_decode (
    const struct _internal_exr_context* pctxt,
    FastHufDecoder*                     fhd,
    const uint8_t*                      src,
    int                                 numSrcBits,
    uint16_t*                           dst,
    int                                 numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char* currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    uint64_t buffer        = READ64 (src);
    int      bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    uint64_t bufferBack        = READ64 ((src + sizeof (uint64_t)));
    int      bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int codeLen;
        int symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (fhd->_tableMin <= buffer)
        {
            int tableIdx =
                fhd->_lookupSymbol[buffer >> (64 - TABLE_LOOKUP_BITS)];

            //
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = tableIdx >> 24;
            symbol  = tableIdx & 0xffffff;
        }
        else
        {
            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            while (fhd->_ljBase[codeLen] >
                   buffer /* && codeLen <= _maxCodeLength */)
                codeLen++;

            if (codeLen > fhd->_maxCodeLength)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            uint64_t id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < (uint64_t) fhd->_numSymbols)
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == fhd->_rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    64 - bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (dstIdx + rleCount > numDstElems)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (rleCount <= 0)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < 64)
        {
            FastHufDecoder_refill (
                &buffer,
                64 - bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}